

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitBooleanExpression
               (ParseNode *expr,ByteCodeLabel trueLabel,ByteCodeLabel falseLabel,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,bool trueFallthrough,
               bool falseFallthrough)

{
  OpCode op;
  RegSlot R1;
  ParseNode *pnode1;
  code *pcVar1;
  bool bVar2;
  ByteCodeLabel BVar3;
  undefined4 *puVar4;
  ParseNodeBin *pPVar5;
  ParseNodeUni *pPVar6;
  ByteCodeWriter *pBVar7;
  ByteCodeLabel leftTrue;
  ByteCodeLabel leftFalse;
  bool falseFallthrough_local;
  bool trueFallthrough_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ByteCodeLabel falseLabel_local;
  ByteCodeLabel trueLabel_local;
  ParseNode *expr_local;
  
  if ((trueFallthrough) && (falseFallthrough)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x245d,"(!trueFallthrough || !falseFallthrough)",
                       "!trueFallthrough || !falseFallthrough");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
  switch(expr->nop) {
  case knopFalse:
    if (!falseFallthrough) {
      pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Br(pBVar7,falseLabel);
    }
    break;
  case knopTrue:
    if (!trueFallthrough) {
      pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Br(pBVar7,trueLabel);
    }
    break;
  default:
    Emit(expr,byteCodeGenerator,funcInfo,0,false,false);
    if (trueFallthrough) {
      pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::BrReg1(pBVar7,BrFalse_A,falseLabel,expr->location);
    }
    else {
      pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::BrReg1(pBVar7,BrTrue_A,trueLabel,expr->location);
      if (!falseFallthrough) {
        pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
        Js::ByteCodeWriter::Br(pBVar7,falseLabel);
      }
    }
    break;
  case knopLogNot:
    pPVar6 = ParseNode::AsParseNodeUni(expr);
    EmitBooleanExpression
              (pPVar6->pnode1,falseLabel,trueLabel,byteCodeGenerator,funcInfo,falseFallthrough,
               trueFallthrough);
    pPVar6 = ParseNode::AsParseNodeUni(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar6->pnode1);
    break;
  case knopEq:
  case knopNe:
  case knopLt:
  case knopLe:
  case knopGe:
  case knopGt:
  case knopEqv:
  case knopNEqv:
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    pnode1 = pPVar5->pnode1;
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    EmitBinaryOpnds(pnode1,pPVar5->pnode2,byteCodeGenerator,funcInfo,0xffffffff);
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar5->pnode2);
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar5->pnode1);
    pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
    op = nopToOp[expr->nop];
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    R1 = pPVar5->pnode1->location;
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    Js::ByteCodeWriter::BrReg2(pBVar7,op,trueLabel,R1,pPVar5->pnode2->location);
    if (!falseFallthrough) {
      pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Br(pBVar7,falseLabel);
    }
    break;
  case knopLogOr:
    pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
    BVar3 = Js::ByteCodeWriter::DefineLabel(pBVar7);
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    EmitBooleanExpression(pPVar5->pnode1,trueLabel,BVar3,byteCodeGenerator,funcInfo,false,true);
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar5->pnode1);
    pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::MarkLabel(pBVar7,BVar3);
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    EmitBooleanExpression
              (pPVar5->pnode2,trueLabel,falseLabel,byteCodeGenerator,funcInfo,trueFallthrough,
               falseFallthrough);
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar5->pnode2);
    break;
  case knopLogAnd:
    pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
    BVar3 = Js::ByteCodeWriter::DefineLabel(pBVar7);
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    EmitBooleanExpression(pPVar5->pnode1,BVar3,falseLabel,byteCodeGenerator,funcInfo,true,false);
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar5->pnode1);
    pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::MarkLabel(pBVar7,BVar3);
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    EmitBooleanExpression
              (pPVar5->pnode2,trueLabel,falseLabel,byteCodeGenerator,funcInfo,trueFallthrough,
               falseFallthrough);
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar5->pnode2);
  }
  ByteCodeGenerator::EndStatement(byteCodeGenerator,expr);
  return;
}

Assistant:

void EmitBooleanExpression(
    _In_ ParseNode* expr,
    Js::ByteCodeLabel trueLabel,
    Js::ByteCodeLabel falseLabel,
    _In_ ByteCodeGenerator* byteCodeGenerator,
    _In_ FuncInfo* funcInfo,
    bool trueFallthrough,
    bool falseFallthrough)
{
    Assert(!trueFallthrough || !falseFallthrough);

    byteCodeGenerator->StartStatement(expr);
    switch (expr->nop)
    {

    case knopLogOr:
    {
        Js::ByteCodeLabel leftFalse = byteCodeGenerator->Writer()->DefineLabel();
        EmitBooleanExpression(expr->AsParseNodeBin()->pnode1, trueLabel, leftFalse, byteCodeGenerator, funcInfo, false, true);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode1);
        byteCodeGenerator->Writer()->MarkLabel(leftFalse);
        EmitBooleanExpression(expr->AsParseNodeBin()->pnode2, trueLabel, falseLabel, byteCodeGenerator, funcInfo, trueFallthrough, falseFallthrough);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode2);
        break;
    }

    case knopLogAnd:
    {
        Js::ByteCodeLabel leftTrue = byteCodeGenerator->Writer()->DefineLabel();
        EmitBooleanExpression(expr->AsParseNodeBin()->pnode1, leftTrue, falseLabel, byteCodeGenerator, funcInfo, true, false);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode1);
        byteCodeGenerator->Writer()->MarkLabel(leftTrue);
        EmitBooleanExpression(expr->AsParseNodeBin()->pnode2, trueLabel, falseLabel, byteCodeGenerator, funcInfo, trueFallthrough, falseFallthrough);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode2);
        break;
    }

    case knopLogNot:
        EmitBooleanExpression(expr->AsParseNodeUni()->pnode1, falseLabel, trueLabel, byteCodeGenerator, funcInfo, falseFallthrough, trueFallthrough);
        funcInfo->ReleaseLoc(expr->AsParseNodeUni()->pnode1);
        break;

    case knopEq:
    case knopEqv:
    case knopNEqv:
    case knopNe:
    case knopLt:
    case knopLe:
    case knopGe:
    case knopGt:
        EmitBinaryOpnds(expr->AsParseNodeBin()->pnode1, expr->AsParseNodeBin()->pnode2, byteCodeGenerator, funcInfo);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode2);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode1);
        byteCodeGenerator->Writer()->BrReg2(nopToOp[expr->nop], trueLabel, expr->AsParseNodeBin()->pnode1->location,
            expr->AsParseNodeBin()->pnode2->location);
        if (!falseFallthrough)
        {
            byteCodeGenerator->Writer()->Br(falseLabel);
        }
        break;
    case knopTrue:
        if (!trueFallthrough)
        {
            byteCodeGenerator->Writer()->Br(trueLabel);
        }
        break;
    case knopFalse:
        if (!falseFallthrough)
        {
            byteCodeGenerator->Writer()->Br(falseLabel);
        }
        break;
    default:
        // Note: we usually release the temp assigned to a node after we Emit it.
        // But in this case, EmitBooleanExpression is just a wrapper around a normal Emit call,
        // and the caller of EmitBooleanExpression expects to be able to release this register.

        Emit(expr, byteCodeGenerator, funcInfo, false);
        if (trueFallthrough)
        {
            byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrFalse_A, falseLabel, expr->location);
        }
        else
        {
            byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, trueLabel, expr->location);
            if (!falseFallthrough)
            {
                byteCodeGenerator->Writer()->Br(falseLabel);
            }
        }
        break;
    }

    byteCodeGenerator->EndStatement(expr);
}